

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIntegers.h
# Opt level: O3

int64_t HighsIntegers::denominator(double x,double eps,int64_t maxdenom)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  HighsCDouble local_78;
  HighsCDouble local_68;
  double local_50;
  undefined1 local_48 [16];
  
  lVar3 = (long)x;
  dVar8 = (double)lVar3;
  local_78.hi = x - dVar8;
  local_78.lo = (-dVar8 - (local_78.hi - x)) + (x - (local_78.hi - (local_78.hi - x))) + 0.0;
  if (local_78.lo + local_78.hi <= eps) {
    lVar7 = 1;
    lVar2 = 0;
    lVar6 = 1;
    local_48._0_8_ = x;
  }
  else {
    local_48._8_4_ = in_XMM0_Dc;
    local_48._0_8_ = x;
    local_48._12_4_ = in_XMM0_Dd;
    lVar2 = 0;
    lVar5 = 1;
    lVar7 = 1;
    local_50 = eps;
    do {
      lVar6 = lVar5;
      lVar4 = lVar3;
      local_68.hi = 1.0;
      local_68.lo = 0.0;
      HighsCDouble::operator/=(&local_68,&local_78);
      lVar3 = lVar4;
      if (9007199254740992.0 < local_68.hi + local_68.lo) break;
      lVar1 = (long)(local_68.hi + local_68.lo);
      lVar5 = lVar6 * lVar1 + lVar2;
      if (maxdenom < lVar5) break;
      lVar3 = lVar4 * lVar1 + lVar7;
      local_78.hi = local_68.hi - (double)lVar1;
      local_78.lo = local_68.lo +
                    (-(double)lVar1 - (local_78.hi - local_68.hi)) +
                    (local_68.hi - (local_78.hi - (local_78.hi - local_68.hi)));
      lVar2 = lVar6;
      lVar6 = lVar5;
      lVar7 = lVar4;
    } while (local_50 < local_78.lo + local_78.hi);
    dVar8 = (double)lVar3;
  }
  lVar5 = (maxdenom - lVar2) / lVar6;
  lVar2 = lVar5 * lVar6 + lVar2;
  auVar9._8_8_ = (double)(lVar3 * lVar5 + lVar7);
  auVar9._0_8_ = dVar8;
  dVar8 = (double)lVar2;
  auVar10._8_4_ = SUB84(dVar8,0);
  auVar10._0_8_ = (double)lVar6;
  auVar10._12_4_ = (int)((ulong)dVar8 >> 0x20);
  auVar10 = divpd(auVar9,auVar10);
  if (ABS(ABS((double)local_48._0_8_) - auVar10._0_8_) <
      ABS(ABS((double)local_48._0_8_) - auVar10._8_8_)) {
    lVar2 = lVar6;
  }
  return lVar2;
}

Assistant:

static int64_t denominator(double x, double eps, int64_t maxdenom) {
    int64_t ai = (int64_t)x;
    int64_t m[] = {ai, 1, 1, 0};

    HighsCDouble xi = x;
    HighsCDouble fraction = xi - double(ai);

    while (fraction > eps) {
      xi = 1.0 / fraction;
      if (double(xi) > double(int64_t{1} << 53)) break;

      ai = (int64_t)(double)xi;
      int64_t t = m[2] * ai + m[3];
      if (t > maxdenom) break;

      m[3] = m[2];
      m[2] = t;

      t = m[0] * ai + m[1];
      m[1] = m[0];
      m[0] = t;

      fraction = xi - ai;
    }

    ai = (maxdenom - m[3]) / m[2];
    m[1] += m[0] * ai;
    m[3] += m[2] * ai;

    double x0 = static_cast<double>(m[0]) / static_cast<double>(m[2]);
    double x1 = static_cast<double>(m[1]) / static_cast<double>(m[3]);
    x = std::abs(x);
    double err0 = std::abs(x - x0);
    double err1 = std::abs(x - x1);

    if (err0 < err1) return m[2];
    return m[3];
  }